

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFAsset.h
# Opt level: O2

Ref<glTF::Node> FindSkeletonRootJoint(Ref<glTF::Skin> *skinRef)

{
  undefined1 (*pauVar1) [12];
  undefined8 *puVar2;
  long lVar3;
  Ref<glTF::Node> RVar4;
  
  puVar2 = *(undefined8 **)
            &((skinRef->vector->super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>).
              _M_impl.super__Vector_impl_data._M_start[skinRef->index]->jointNames).
             super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>.
             _M_impl;
  lVar3 = *(long *)(*(long *)*puVar2 + (ulong)*(uint *)(puVar2 + 1) * 8);
  do {
    pauVar1 = (undefined1 (*) [12])(lVar3 + 0x158);
    lVar3 = *(long *)(**(long **)*pauVar1 + (ulong)*(uint *)(lVar3 + 0x160) * 8);
  } while (*(long *)(lVar3 + 0x140) != 0);
  RVar4._12_4_ = 0;
  RVar4._0_12_ = *pauVar1;
  return RVar4;
}

Assistant:

T* operator->()
            { return (*vector)[index]; }